

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::Transpose::forward_impl
          (Transpose *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  Tensor *this_00;
  uint b;
  uint bid;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *local_a0;
  PointerType local_98;
  long lStack_90;
  long local_88;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  if ((((this->super_Node).dim.d[0] == 1) || ((this->super_Node).dim.nd < 2)) ||
     ((this->super_Node).dim.d[1] == 1)) {
    fx->v = (*(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->v;
  }
  else {
    for (bid = 0; this_00 = *(xs->
                             super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                             )._M_impl.super__Vector_impl_data._M_start, bid < (this_00->d).bd;
        bid = bid + 1) {
      Tensor::batch_matrix(&local_70,this_00,bid);
      local_88 = local_70.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value;
      local_98 = local_70.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data;
      lStack_90 = local_70.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_rows.m_value;
      Tensor::batch_matrix(&local_50,fx,bid);
      local_a0 = &local_50;
      Eigen::
      NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
      ::operator=((NoAlias<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
                   *)&local_a0,
                  (MatrixBase<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                   *)&local_98);
    }
  }
  return;
}

Assistant:

void Transpose::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  if (dim.rows() == 1 || dim.cols() == 1) {
    fx.v = xs[0]->v;
  } else {
#if HAVE_CUDA
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      CUBLAS_CHECK(cublasSgeam(cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N, fx.d.rows(), fx.d.cols(),
                               kSCALAR_ONE, xs[0]->batch_ptr(b), xs[0]->d.rows(), kSCALAR_ZERO, NULL, fx.d.rows(), fx.batch_ptr(b), fx.d.rows()));
#else
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      fx.batch_matrix(b).noalias() = xs[0]->batch_matrix(b).transpose();
#endif
  }
}